

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::lexer::strtonum::parse<double>(void *param_1,strtonum *param_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  char *__first;
  char *pcVar1;
  reference pvVar2;
  value_type *pvVar3;
  byte bVar4;
  bool ok;
  char *endptr;
  size_t ds_pos;
  char *data;
  char decimal_point_char;
  lconv *loc;
  size_t len;
  array<char,_64UL> buf;
  string tempstr;
  size_type in_stack_fffffffffffffee8;
  undefined6 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef6;
  undefined1 in_stack_fffffffffffffef7;
  value_type vVar5;
  char *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  char *in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  char local_d1;
  char *local_c0 [3];
  undefined1 local_a1;
  long local_a0;
  char *local_98;
  value_type local_89;
  lconv *local_88;
  long local_80;
  array<char,_64UL> local_78;
  string local_38 [32];
  strtonum *local_18;
  void *local_10;
  
  local_18 = param_2;
  local_10 = param_1;
  std::__cxx11::string::string(local_38);
  local_80 = *(long *)((long)param_1 + 8) - *param_1;
  local_88 = localeconv();
  if (local_88->decimal_point == (char *)0x0) {
    local_d1 = '.';
  }
  else {
    local_d1 = *local_88->decimal_point;
  }
  local_89 = local_d1;
  local_98 = *param_1;
  if (local_d1 != '.') {
    local_a1 = 0x2e;
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::find<char_const*,char>
                     (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                      (char *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
    local_a0 = (long)this - *param_1;
    if (local_a0 != local_80) {
      __first = (char *)(local_80 + 1);
      pcVar1 = (char *)std::array<char,_64UL>::size(&local_78);
      if (__first < pcVar1) {
        std::array<char,_64UL>::begin((array<char,_64UL> *)0x3b5924);
        std::copy<char_const*,char*>
                  ((char *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                   in_stack_fffffffffffffef8,
                   (char *)CONCAT17(in_stack_fffffffffffffef7,
                                    CONCAT16(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0)));
        pvVar2 = std::array<char,_64UL>::operator[]
                           ((array<char,_64UL> *)
                            CONCAT17(in_stack_fffffffffffffef7,
                                     CONCAT16(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0)),
                            in_stack_fffffffffffffee8);
        *pvVar2 = '\0';
        vVar5 = local_89;
        pvVar2 = std::array<char,_64UL>::operator[]
                           ((array<char,_64UL> *)
                            CONCAT17(in_stack_fffffffffffffef7,
                                     CONCAT16(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0)),
                            in_stack_fffffffffffffee8);
        *pvVar2 = vVar5;
        local_98 = std::array<char,_64UL>::data((array<char,_64UL> *)0x3b5980);
      }
      else {
        std::__cxx11::string::assign<char_const*,void>(this,__first,in_stack_ffffffffffffff10);
        vVar5 = local_89;
        pvVar3 = (value_type *)std::__cxx11::string::operator[]((ulong)local_38);
        *pvVar3 = vVar5;
        local_98 = (char *)std::__cxx11::string::c_str();
      }
    }
  }
  local_c0[0] = (char *)0x0;
  local_18->m_start = (char *)0x0;
  strtof(local_18,local_98,local_c0);
  bVar4 = local_c0[0] == local_98 + local_80;
  if (((((bool)bVar4) && ((double)local_18->m_start == 0.0)) && (!NAN((double)local_18->m_start)))
     && (*local_98 == '-')) {
    local_18->m_start = (char *)0x8000000000000000;
  }
  std::__cxx11::string::~string(local_38);
  return (bool)(bVar4 & 1);
}

Assistant:

bool parse(T& value, /*is_integral=*/std::false_type) const
            {
                // replace decimal separator with locale-specific version,
                // when necessary; data will point to either the original
                // string, or buf, or tempstr containing the fixed string.
                std::string tempstr;
                std::array<char, 64> buf;
                const size_t len = static_cast<size_t>(m_end - m_start);

                // lexer will reject empty numbers
                assert(len > 0);

                // since dealing with strtod family of functions, we're
                // getting the decimal point char from the C locale facilities
                // instead of C++'s numpunct facet of the current std::locale
                const auto loc = localeconv();
                assert(loc != nullptr);
                const char decimal_point_char = (loc->decimal_point == nullptr) ? '.' : loc->decimal_point[0];

                const char* data = m_start;

                if (decimal_point_char != '.')
                {
                    const size_t ds_pos = static_cast<size_t>(std::find(m_start, m_end, '.') - m_start);

                    if (ds_pos != len)
                    {
                        // copy the data into the local buffer or tempstr, if
                        // buffer is too small; replace decimal separator, and
                        // update data to point to the modified bytes
                        if ((len + 1) < buf.size())
                        {
                            std::copy(m_start, m_end, buf.begin());
                            buf[len] = 0;
                            buf[ds_pos] = decimal_point_char;
                            data = buf.data();
                        }
                        else
                        {
                            tempstr.assign(m_start, m_end);
                            tempstr[ds_pos] = decimal_point_char;
                            data = tempstr.c_str();
                        }
                    }
                }

                char* endptr = nullptr;
                value = 0;
                // this calls appropriate overload depending on T
                strtof(value, data, &endptr);

                // parsing was successful iff strtof parsed exactly the number
                // of characters determined by the lexer (len)
                const bool ok = (endptr == (data + len));

                if (ok and (value == static_cast<T>(0.0)) and (*data == '-'))
                {
                    // some implementations forget to negate the zero
                    value = -0.0;
                }

                return ok;
            }